

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_8tap_avx2(InterpFilterParams *filter_params,int32_t subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m256i coeff;
  __m128i coeff_8;
  int16_t *filter;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  auVar1._8_8_ = uStack_28;
  auVar1._0_8_ = uStack_30;
  auVar1._16_8_ = uStack_30;
  auVar1._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar1,0);
  *in_RDX = auVar1;
  auVar2._8_8_ = uStack_28;
  auVar2._0_8_ = uStack_30;
  auVar2._16_8_ = uStack_30;
  auVar2._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar2,0x55);
  in_RDX[1] = auVar1;
  auVar3._8_8_ = uStack_28;
  auVar3._0_8_ = uStack_30;
  auVar3._16_8_ = uStack_30;
  auVar3._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar3,0xaa);
  in_RDX[2] = auVar1;
  auVar4._8_8_ = uStack_28;
  auVar4._0_8_ = uStack_30;
  auVar4._16_8_ = uStack_30;
  auVar4._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar4,0xff);
  in_RDX[3] = auVar1;
  return;
}

Assistant:

static inline void prepare_coeffs_8tap_avx2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m256i *const coeffs /* [4] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  const __m128i coeff_8 = _mm_loadu_si128((__m128i *)filter);
  const __m256i coeff = _mm256_broadcastsi128_si256(coeff_8);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi32(coeff, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi32(coeff, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi32(coeff, 0xff);
}